

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O0

int add_tree(IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,float *numeric_data,
            size_t ncols_numeric,int *categ_data,size_t ncols_categ,int *ncat,float *Xc,
            int64_t *Xc_ind,int64_t *Xc_indptr,size_t ndim,size_t ntry,CoefType coef_type,
            bool coef_by_prop,float *sample_weights,size_t nrows,size_t max_depth,
            size_t ncols_per_tree,bool limit_depth,bool penalize_range,bool standardize_data,
            bool fast_bratio,float *col_weights,bool weigh_by_kurt,double prob_pick_by_gain_pl,
            double prob_pick_by_gain_avg,double prob_pick_by_full_gain,double prob_pick_by_dens,
            double prob_pick_col_by_range,double prob_pick_col_by_var,double prob_pick_col_by_kurt,
            double min_gain,MissingAction missing_action,CategSplit cat_split_type,
            NewCategAction new_cat_action,UseDepthImp depth_imp,WeighImpRows weigh_imp_rows,
            bool all_perm,Imputer *imputer,size_t min_imp_obs,TreesIndexer *indexer,
            float *ref_numeric_data,int *ref_categ_data,bool ref_is_col_major,size_t ref_ld_numeric,
            size_t ref_ld_categ,float *ref_Xc,int64_t *ref_Xc_ind,int64_t *ref_Xc_indptr,
            uint64_t random_seed,bool use_long_double)

{
  int iVar1;
  double unaff_RBP;
  undefined8 unaff_R13;
  double unaff_R14;
  double unaff_R15;
  double unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  bool in_stack_0000002a;
  bool in_stack_0000002b;
  bool in_stack_0000002c;
  bool in_stack_0000002d;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  size_t in_stack_00000030;
  undefined4 in_stack_00000038;
  undefined4 in_stack_0000003c;
  undefined1 in_stack_00000040;
  undefined7 in_stack_00000041;
  float *in_stack_00000048;
  ExtIsoForest *in_stack_00000050;
  IsoForest *in_stack_00000058;
  undefined4 in_stack_000000a0;
  undefined4 in_stack_000000a4;
  undefined4 in_stack_000000a8;
  undefined4 in_stack_000000ac;
  undefined4 in_stack_000000b0;
  undefined4 in_stack_000000b4;
  undefined4 in_stack_000000b8;
  undefined4 in_stack_000000bc;
  undefined1 in_stack_000000c0;
  undefined7 in_stack_000000c1;
  size_t in_stack_000000c8;
  CoefType in_stack_000000d0;
  float *in_stack_000000e0;
  size_t in_stack_000000e8;
  undefined1 in_stack_000000f0;
  undefined7 in_stack_000000f1;
  size_t in_stack_000000f8;
  float *in_stack_00000120;
  MissingAction in_stack_00000130;
  CategSplit in_stack_00000138;
  NewCategAction in_stack_00000140;
  UseDepthImp in_stack_00000148;
  WeighImpRows in_stack_00000150;
  Imputer *in_stack_00000160;
  size_t in_stack_00000168;
  TreesIndexer *in_stack_00000170;
  float *in_stack_00000178;
  int *in_stack_00000180;
  size_t in_stack_00000190;
  size_t in_stack_00000198;
  float *in_stack_000001a0;
  long *in_stack_000001a8;
  long *in_stack_000001b0;
  uint64_t in_stack_000001b8;
  
  iVar1 = add_tree<float,long>
                    (in_stack_00000058,in_stack_00000050,in_stack_00000048,
                     CONCAT71(in_stack_00000041,in_stack_00000040),
                     (int *)CONCAT44(in_stack_0000003c,in_stack_00000038),in_stack_00000030,
                     (int *)CONCAT44(in_stack_000000a4,in_stack_000000a0),
                     (float *)CONCAT44(in_stack_000000ac,in_stack_000000a8),
                     (long *)CONCAT44(in_stack_000000b4,in_stack_000000b0),
                     (long *)CONCAT44(in_stack_000000bc,in_stack_000000b8),
                     CONCAT71(in_stack_000000c1,in_stack_000000c0),in_stack_000000c8,
                     in_stack_000000d0,in_stack_0000002f,in_stack_000000e0,in_stack_000000e8,
                     CONCAT71(in_stack_000000f1,in_stack_000000f0),in_stack_000000f8,
                     in_stack_0000002e,in_stack_0000002d,in_stack_0000002c,in_stack_0000002b,
                     in_stack_00000120,in_stack_0000002a,in_stack_00000020,in_stack_00000018,
                     in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBP,unaff_R15,unaff_R14
                     ,in_stack_00000130,in_stack_00000138,in_stack_00000140,in_stack_00000148,
                     in_stack_00000150,SUB81((ulong)unaff_R13 >> 0x38,0),in_stack_00000160,
                     in_stack_00000168,in_stack_00000170,in_stack_00000178,in_stack_00000180,
                     SUB81((ulong)unaff_R13 >> 0x30,0),in_stack_00000190,in_stack_00000198,
                     in_stack_000001a0,in_stack_000001a8,in_stack_000001b0,in_stack_000001b8,
                     SUB81((ulong)unaff_R13 >> 0x28,0));
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED int add_tree(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
             real_t numeric_data[],  size_t ncols_numeric,
             int    categ_data[],    size_t ncols_categ,    int ncat[],
             real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
             size_t ndim, size_t ntry, CoefType coef_type, bool coef_by_prop,
             real_t sample_weights[], size_t nrows,
             size_t max_depth,     size_t ncols_per_tree,
             bool   limit_depth,   bool penalize_range, bool standardize_data,
             bool   fast_bratio,
             real_t col_weights[], bool weigh_by_kurt,
             double prob_pick_by_gain_pl, double prob_pick_by_gain_avg,
             double prob_pick_by_full_gain, double prob_pick_by_dens,
             double prob_pick_col_by_range, double prob_pick_col_by_var,
             double prob_pick_col_by_kurt,
             double min_gain, MissingAction missing_action,
             CategSplit cat_split_type, NewCategAction new_cat_action,
             UseDepthImp depth_imp, WeighImpRows weigh_imp_rows,
             bool   all_perm, Imputer *imputer, size_t min_imp_obs,
             TreesIndexer *indexer,
             real_t ref_numeric_data[], int ref_categ_data[],
             bool ref_is_col_major, size_t ref_ld_numeric, size_t ref_ld_categ,
             real_t ref_Xc[], sparse_ix ref_Xc_ind[], sparse_ix ref_Xc_indptr[],
             uint64_t random_seed, bool use_long_double)
{
    return add_tree<real_t, sparse_ix>
            (model_outputs, model_outputs_ext,
             numeric_data,  ncols_numeric,
             categ_data,    ncols_categ,    ncat,
             Xc, Xc_ind, Xc_indptr,
             ndim, ntry, coef_type, coef_by_prop,
             sample_weights, nrows,
             max_depth,     ncols_per_tree,
             limit_depth,   penalize_range, standardize_data,
             fast_bratio,
             col_weights, weigh_by_kurt,
             prob_pick_by_gain_pl, prob_pick_by_gain_avg,
             prob_pick_by_full_gain, prob_pick_by_dens,
             prob_pick_col_by_range, prob_pick_col_by_var,
             prob_pick_col_by_kurt,
             min_gain, missing_action,
             cat_split_type, new_cat_action,
             depth_imp, weigh_imp_rows,
             all_perm, imputer, min_imp_obs,
             indexer,
             ref_numeric_data, ref_categ_data,
             ref_is_col_major, ref_ld_numeric, ref_ld_categ,
             ref_Xc, ref_Xc_ind, ref_Xc_indptr,
             random_seed, use_long_double);
}